

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# citylots_std.cpp
# Opt level: O2

void * parseDictionary(SymbolContext<char> *ctx)

{
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue>
  *this;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,JSONValue>,std::allocator<std::pair<std::__cxx11::string_const,JSONValue>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var1;
  undefined4 *puVar2;
  int i;
  long lVar3;
  
  p_Var1 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,JSONValue>,std::allocator<std::pair<std::__cxx11::string_const,JSONValue>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            *)operator_new(0x38);
  *(_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,JSONValue>,std::allocator<std::pair<std::__cxx11::string_const,JSONValue>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    **)p_Var1 = p_Var1 + 0x30;
  *(undefined8 *)(p_Var1 + 8) = 1;
  *(undefined8 *)(p_Var1 + 0x10) = 0;
  *(undefined8 *)(p_Var1 + 0x18) = 0;
  *(undefined8 *)(p_Var1 + 0x20) = 0;
  *(undefined8 *)(p_Var1 + 0x28) = 0;
  *(undefined4 *)(p_Var1 + 0x20) = 0x3f800000;
  *(undefined8 *)(p_Var1 + 0x28) = 0;
  *(undefined8 *)(p_Var1 + 0x30) = 0;
  for (lVar3 = 1; lVar3 <= ctx->num_values; lVar3 = lVar3 + 1) {
    this = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue>
            *)ctx->values[lVar3 + -1];
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,JSONValue>,std::allocator<std::pair<std::__cxx11::string_const,JSONValue>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::__cxx11::string&,JSONValue>(p_Var1,this,&this->second);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_JSONValue>
    ::~pair(this);
    operator_delete(this);
  }
  puVar2 = (undefined4 *)operator_new(0x10);
  *puVar2 = 5;
  *(_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,JSONValue>,std::allocator<std::pair<std::__cxx11::string_const,JSONValue>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    **)(puVar2 + 2) = p_Var1;
  return puVar2;
}

Assistant:

void *parseDictionary(const SymbolContext<char>& ctx)
{
    JSONObject *o = new JSONObject();
    for (int i = 1; i <= ctx.count(); i++)
    {
        std::pair<JSONString, JSONValue> *p = ctx.value<std::pair<JSONString, JSONValue> >(i);
        o->emplace(p->first, std::move(p->second));
        delete p;
    }
    return new JSONValue(o);
}